

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_24c316::BuildSystemFrontendImpl::initialize(BuildSystemFrontendImpl *this)

{
  atomic<unsigned_int> *paVar1;
  BuildSystem *this_00;
  Child CVar2;
  ulong uVar3;
  StringRef mainFilename;
  StringRef path;
  undefined1 RHSKind;
  unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
  *this_01;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Child CVar7;
  FileSystem *pFVar8;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  Style SVar12;
  undefined1 LHSKind;
  BuildSystemInvocation *pBVar13;
  BuildSystemFrontendDelegate *pBVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  StringRef path_00;
  StringRef Str;
  StringRef path_01;
  StringRef path_02;
  string error_1;
  StringRef dir;
  string error;
  Child local_1e0;
  undefined8 uStack_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  Child local_1c0;
  undefined8 uStack_1b8;
  Child local_1b0 [2];
  Child local_1a0;
  ulong local_198;
  Child local_190;
  size_t local_188;
  unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
  *local_178;
  Twine local_170;
  Child local_158;
  undefined8 uStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [16];
  StringRef local_40;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->stateMutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  LOCK();
  (this->delegateImpl->numFailedCommands).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &this->delegateImpl->numErrors;
  SVar12 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i = 0;
  UNLOCK();
  bVar4 = false;
  if (this->cancelled != false) goto LAB_001749db;
  this_00 = (this->system)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>._M_head_impl;
  if (this_00 != (BuildSystem *)0x0) {
    llbuild::buildsystem::BuildSystem::resetForBuild(this_00);
    bVar4 = true;
    goto LAB_001749db;
  }
  if (((this->invocation->chdirPath)._M_string_length == 0) ||
     (iVar6 = llbuild::basic::sys::chdir((this->invocation->chdirPath)._M_dataplus._M_p),
     (char)iVar6 != '\0')) {
    CVar2 = (Child)(this->fileSystem)._M_t.
                   super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                   .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CVar2.twine ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pBVar14 = this->delegate;
      llvm::Twine::Twine((Twine *)&local_158,"invalid reuse after initialization failure");
      goto LAB_0017491d;
    }
    local_178 = &this->system;
    pBVar14 = this->delegate;
    CVar7.twine = (Twine *)operator_new(8);
    (this->fileSystem)._M_t.
    super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
    .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
    local_158 = CVar2;
    llbuild::buildsystem::BuildSystem::BuildSystem
              ((BuildSystem *)CVar7.twine,&pBVar14->super_BuildSystemDelegate,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.twine !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_1e0.twine = CVar7.twine;
      (**(code **)(*local_158.decUL + 8))();
      CVar7 = local_1e0;
    }
    this_01 = local_178;
    local_1e0.twine = (Twine *)0x0;
    std::
    __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
    ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
             *)local_178,(pointer)CVar7.twine);
    std::
    unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                   *)&local_1e0);
    mainFilename.Data = (this->invocation->buildFilePath)._M_dataplus._M_p;
    mainFilename.Length = (this->invocation->buildFilePath)._M_string_length;
    bVar4 = llbuild::buildsystem::BuildSystem::loadDescription
                      ((this->system)._M_t.
                       super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                       _M_head_impl,mainFilename);
    if (!bVar4) {
LAB_001749ce:
      bVar4 = false;
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_01,(pointer)0x0);
      goto LAB_001749db;
    }
    pBVar13 = this->invocation;
    pcVar10 = (char *)(pBVar13->traceFilePath)._M_string_length;
    if (pcVar10 == (char *)0x0) {
LAB_00174a59:
      uVar3 = (pBVar13->dbPath)._M_string_length;
      bVar4 = true;
      if (uVar3 == 0) goto LAB_001749db;
      local_158.twine = (Twine *)local_148;
      uStack_150 = 0x10000000000;
      local_1a0 = (Child)(pBVar13->dbPath)._M_dataplus._M_p;
      local_198 = uVar3;
      llvm::Twine::Twine((Twine *)&local_1e0,&pBVar13->dbPath);
      bVar5 = llvm::sys::path::is_relative((Twine *)&local_1e0,native);
      if (bVar5) {
        SVar12 = windows;
        Str.Length = 3;
        Str.Data = "://";
        sVar11 = llvm::StringRef::find((StringRef *)&local_1a0,Str,0);
        if ((sVar11 == 0xffffffffffffffff) && ((local_198 == 0 || (*local_1a0.cString != ':')))) {
          path_02.Length = 2;
          path_02.Data = (char *)(this->invocation->buildFilePath)._M_string_length;
          local_40 = llvm::sys::path::parent_path
                               ((path *)(this->invocation->buildFilePath)._M_dataplus._M_p,path_02,
                                SVar12);
          llvm::Twine::Twine((Twine *)&local_1e0,&local_40);
          llvm::Twine::Twine((Twine *)&local_1c0,&this->invocation->dbPath);
          llvm::Twine::Twine(&local_170,"");
          llvm::Twine::Twine((Twine *)&local_190,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_158,(Twine *)&local_1e0,(Twine *)&local_1c0,
                     &local_170,(Twine *)&local_190);
          local_1a0.twine = local_158.twine;
          local_198 = uStack_150 & 0xffffffff;
        }
      }
      uStack_1d8 = 0;
      local_1d0._M_local_buf[0] = NullKind;
      path_01.Length = local_198;
      path_01.Data = local_1a0.cString;
      local_1e0.twine = (Twine *)&local_1d0;
      bVar5 = llbuild::buildsystem::BuildSystem::attachDB
                        ((this_01->_M_t).
                         super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                         _M_head_impl,path_01,(string *)&local_1e0);
      if (bVar5) {
        if (local_1e0.twine != (Twine *)&local_1d0) {
          operator_delete(local_1e0.twine,
                          CONCAT62(local_1d0._M_allocated_capacity._2_6_,
                                   CONCAT11(local_1d0._M_local_buf[1],local_1d0._M_local_buf[0])) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.twine != local_148) {
          free(local_158.twine);
        }
        goto LAB_001749db;
      }
      pBVar14 = this->delegate;
      llvm::Twine::Twine(&local_170,"unable to attach DB: ");
      llvm::Twine::Twine((Twine *)&local_190,(string *)&local_1e0);
      llvm::operator+((Twine *)&local_1c0,&local_170,(Twine *)&local_190);
      llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar14,(Twine *)&local_1c0);
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_01,(pointer)0x0);
      if (local_1e0.twine != (Twine *)&local_1d0) {
        operator_delete(local_1e0.twine,
                        CONCAT62(local_1d0._M_allocated_capacity._2_6_,
                                 CONCAT11(local_1d0._M_local_buf[1],local_1d0._M_local_buf[0])) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.twine != local_148) {
        free(local_158.twine);
      }
    }
    else {
      path_00.Length = 2;
      path_00.Data = pcVar10;
      _local_190 = llvm::sys::path::parent_path
                             ((path *)(pBVar13->traceFilePath)._M_dataplus._M_p,path_00,SVar12);
      sVar11 = local_190;
      pcVar10 = local_190;
      pFVar8 = llbuild::buildsystem::BuildSystem::getFileSystem
                         ((this_01->_M_t).
                          super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                          .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                          _M_head_impl);
      local_1e0.twine = (Twine *)&local_1d0;
      if (pcVar10 == (char *)0x0) {
        uStack_1d8 = 0;
        local_1d0._M_local_buf[0] = NullKind;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e0,pcVar10,pcVar10 + sVar11);
      }
      iVar6 = (*pFVar8->_vptr_FileSystem[3])(pFVar8,&local_1e0);
      if ((char)iVar6 == '\0') {
        pFVar8 = llbuild::buildsystem::BuildSystem::getFileSystem
                           ((this_01->_M_t).
                            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                            _M_head_impl);
        local_1c0.twine = (Twine *)local_1b0;
        if (local_190.twine == (Twine *)0x0) {
          uStack_1b8 = 0;
          local_1b0[0].character = NullKind;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,local_190.twine,
                     (char *)((long)&(local_190.twine)->LHS + local_188));
        }
        (*pFVar8->_vptr_FileSystem[7])(&local_158,pFVar8);
        bVar4 = llbuild::basic::FileInfo::isDirectory((FileInfo *)&local_158);
        if (&(local_1c0.twine)->LHS != local_1b0) {
          operator_delete(local_1c0.twine,
                          CONCAT62(local_1b0[0]._2_6_,
                                   CONCAT11(local_1b0[0].decUI._1_1_,local_1b0[0].character)) + 1);
        }
        bVar4 = !bVar4;
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.twine != &local_1d0) {
        operator_delete(local_1e0.twine,
                        CONCAT62(local_1d0._M_allocated_capacity._2_6_,
                                 CONCAT11(local_1d0._M_local_buf[1],local_1d0._M_local_buf[0])) + 1)
        ;
      }
      if (bVar4) {
        pBVar14 = this->delegate;
        llvm::Twine::Twine((Twine *)&local_158,"unable to create tracing directory: ",
                           (StringRef *)&local_190);
        llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar14,(Twine *)&local_158);
        goto LAB_001749ce;
      }
      uStack_150 = 0;
      local_148[0]._M_allocated_capacity = local_148[0]._M_allocated_capacity & 0xffffffffffffff00;
      path.Data = (this->invocation->traceFilePath)._M_dataplus._M_p;
      path.Length = (this->invocation->traceFilePath)._M_string_length;
      local_158.twine = (Twine *)local_148;
      bVar4 = llbuild::buildsystem::BuildSystem::enableTracing
                        ((this->system)._M_t.
                         super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                         _M_head_impl,path,(string *)&local_158);
      if (bVar4) {
        if (local_158.twine != (Twine *)local_148) {
          operator_delete(local_158.twine,local_148[0]._M_allocated_capacity + 1);
        }
        pBVar13 = this->invocation;
        goto LAB_00174a59;
      }
      pBVar14 = this->delegate;
      llvm::Twine::Twine((Twine *)&local_1c0,"unable to enable tracing: ");
      llvm::Twine::Twine(&local_170,(string *)&local_158);
      llvm::operator+((Twine *)&local_1e0,(Twine *)&local_1c0,&local_170);
      llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar14,(Twine *)&local_1e0);
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_01,(pointer)0x0);
      if (local_158.twine != (Twine *)local_148) {
        operator_delete(local_158.twine,local_148[0]._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pBVar14 = this->delegate;
    llvm::Twine::Twine((Twine *)&local_1e0,"unable to honor --chdir: ");
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    llvm::Twine::Twine((Twine *)&local_1c0,pcVar10);
    if ((local_1d0._M_local_buf[0] == NullKind) || (local_1b0[0].character == NullKind)) {
      local_148[0]._0_2_ = 0x100;
    }
    else {
      if (local_1d0._M_local_buf[0] == EmptyKind) {
        local_148[0]._0_8_ =
             CONCAT62(local_1b0[0]._2_6_,CONCAT11(local_1b0[0].decUI._1_1_,local_1b0[0].character));
        local_158.decUI = local_1c0.decUI;
        local_158._4_4_ = local_1c0._4_4_;
        uVar15 = (undefined4)uStack_1b8;
        uVar16 = uStack_1b8._4_4_;
      }
      else {
        if (local_1b0[0].character != EmptyKind) {
          CVar2 = local_1e0;
          LHSKind = local_1d0._M_local_buf[0];
          if (local_1d0._M_local_buf[1] != '\x01') {
            CVar2.twine = (Twine *)&local_1e0;
            LHSKind = TwineKind;
          }
          CVar7 = local_1c0;
          RHSKind = local_1b0[0].character;
          if (local_1b0[0].decUI._1_1_ != '\x01') {
            CVar7.twine = (Twine *)&local_1c0;
            RHSKind = TwineKind;
          }
          llvm::Twine::Twine((Twine *)&local_158,CVar2,LHSKind,CVar7,RHSKind);
          goto LAB_0017491d;
        }
        local_148[0]._0_8_ =
             CONCAT62(local_1d0._M_allocated_capacity._2_6_,
                      CONCAT11(local_1d0._M_local_buf[1],local_1d0._M_local_buf[0]));
        local_158.decUI = local_1e0.decUI;
        local_158._4_4_ = local_1e0._4_4_;
        uVar15 = (undefined4)uStack_1d8;
        uVar16 = uStack_1d8._4_4_;
      }
      uStack_150 = CONCAT44(uVar16,uVar15);
    }
LAB_0017491d:
    llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar14,(Twine *)&local_158);
  }
  bVar4 = false;
LAB_001749db:
  pthread_mutex_unlock((pthread_mutex_t *)&this->stateMutex);
  return bVar4;
}

Assistant:

bool initialize() {
    std::lock_guard<std::mutex> lock(stateMutex);

    delegateImpl->numFailedCommands = 0;
    delegateImpl->numErrors = 0;

    if (cancelled)
      return false;

    if (system) {
      // Already exists, just reset state
      system->resetForBuild();
      return true;
    }

    if (!invocation.chdirPath.empty()) {
      if (!sys::chdir(invocation.chdirPath.c_str())) {
        delegate.error(Twine("unable to honor --chdir: ") + strerror(errno));
        return false;
      }
    }

    if (!fileSystem) {
      // Catch and report client misuse of a failed build system object
      delegate.error(Twine("invalid reuse after initialization failure"));
      return false;
    }

    // Create the build system.
    system = std::make_unique<BuildSystem>(delegate, std::move(fileSystem));

    // Load the build file.
    if (!system->loadDescription(invocation.buildFilePath)) {
      system = nullptr;
      return false;
    }

    // Enable tracing, if requested.
    if (!invocation.traceFilePath.empty()) {
      const auto dir = llvm::sys::path::parent_path(invocation.traceFilePath);
      if (!system->getFileSystem().createDirectories(dir) &&
          !system->getFileSystem().getFileInfo(dir).isDirectory()) {
        delegate.error(Twine("unable to create tracing directory: " + dir));
        system = nullptr;
        return false;
      }

      std::string error;
      if (!system->enableTracing(invocation.traceFilePath, &error)) {
        delegate.error(Twine("unable to enable tracing: ") + error);
        system = nullptr;
        return false;
      }
    }

    // Attach the database.
    if (!invocation.dbPath.empty()) {
      // If the database path is relative, always make it relative to the input
      // file.
      SmallString<256> tmp;
      StringRef dbPath = invocation.dbPath;
      if (llvm::sys::path::is_relative(invocation.dbPath) &&
          dbPath.find("://") == StringRef::npos && !dbPath.startswith(":")) {
        llvm::sys::path::append(
            tmp, llvm::sys::path::parent_path(invocation.buildFilePath),
            invocation.dbPath);
        dbPath = tmp.str();
      }

      std::string error;
      if (!system->attachDB(dbPath, &error)) {
        delegate.error(Twine("unable to attach DB: ") + error);
        system = nullptr;
        return false;
      }
    }

    return true;
  }